

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
ParticleArrayTest_Back_Test
          (ParticleArrayTest_Back_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::ParticleArrayTest
            (&this->
              super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>)
  ;
  (this->super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture.super_Test.
  _vptr_Test = (_func_int **)&PTR__Test_001f9600;
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}